

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcu_list.hpp
# Opt level: O0

void __thiscall
gmlc::libguarded::
rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>
::rcu_guard::rcu_read_lock
          (rcu_guard *this,
          rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>
          *list)

{
  bool bVar1;
  pointer pzVar2;
  __pointer_type local_28;
  zombie_list_node *oldNext;
  rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>
  *local_18;
  rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>
  *list_local;
  rcu_guard *this_local;
  
  this->m_list = list;
  local_18 = list;
  list_local = (rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>
                *)this;
  pzVar2 = std::
           allocator_traits<MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node>_>
           ::allocate(&list->m_zombie_alloc,1);
  this->m_zombie = pzVar2;
  oldNext = (zombie_list_node *)this;
  std::
  allocator_traits<MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256ul,16ul>::type,std::mutex,MockAllocator<std::aligned_storage<256ul,16ul>::type>>::zombie_list_node>>
  ::
  construct<gmlc::libguarded::rcu_list<std::aligned_storage<256ul,16ul>::type,std::mutex,MockAllocator<std::aligned_storage<256ul,16ul>::type>>::zombie_list_node,gmlc::libguarded::rcu_list<std::aligned_storage<256ul,16ul>::type,std::mutex,MockAllocator<std::aligned_storage<256ul,16ul>::type>>::rcu_guard*>
            (&local_18->m_zombie_alloc,this->m_zombie,(rcu_guard **)&oldNext);
  local_28 = std::
             atomic<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node_*>
             ::load(&local_18->m_zombie_head,memory_order_relaxed);
  do {
    std::
    atomic<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node_*>
    ::store(&this->m_zombie->next,local_28,memory_order_relaxed);
    bVar1 = std::
            atomic<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node_*>
            ::compare_exchange_weak
                      (&local_18->m_zombie_head,&local_28,this->m_zombie,memory_order_seq_cst);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return;
}

Assistant:

void rcu_list<T, M, Alloc>::rcu_guard::rcu_read_lock(
    const rcu_list<T, M, Alloc>& list)

{
    m_list = &list;
    m_zombie = zombie_alloc_trait::allocate(list.m_zombie_alloc, 1);
    zombie_alloc_trait::construct(list.m_zombie_alloc, m_zombie, this);
    zombie_list_node* oldNext =
        list.m_zombie_head.load(std::memory_order_relaxed);

    do {
        m_zombie->next.store(oldNext, std::memory_order_relaxed);
    } while (!list.m_zombie_head.compare_exchange_weak(oldNext, m_zombie));
}